

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

int reduce_pp_expression(Context_conflict1 *ctx)

{
  IncludeState *state;
  Token TVar1;
  int iVar2;
  int iVar3;
  Token TVar4;
  Define *pDVar5;
  Context_conflict1 *pCVar6;
  bool bVar7;
  ulong uVar8;
  Token TVar9;
  int *piVar10;
  char *reason;
  ulong uVar11;
  bool bVar12;
  Context_conflict1 *local_948;
  IncludeState *local_940;
  ulong local_938 [126];
  Token aTStack_544 [3];
  Token stack [64];
  RpnTokens output [128];
  
  local_940 = ctx->include_stack;
  bVar12 = true;
  uVar8 = 0;
  uVar11 = 0;
  local_948 = ctx;
  TVar1 = TOKEN_UNKNOWN;
LAB_0012a709:
  while (TVar9 = TVar1, bVar12) {
    state = ctx->include_stack;
    TVar1 = lexer(state);
    bVar7 = false;
    if (TVar1 == 0x21) goto LAB_0012a8a9;
    if (TVar1 == 0x2b) {
      bVar7 = TVar9 == 0x29 || TVar9 == TOKEN_INT_LITERAL;
      if ((TVar9 == 0x29) || (TVar9 == TOKEN_INT_LITERAL)) {
        TVar1 = 0x2b;
      }
      else {
        TVar1 = TOKEN_PP_UNARY_PLUS;
      }
LAB_0012a7b5:
      ctx->recursion_count = 0;
      goto LAB_0012a7bd;
    }
    if (TVar1 != TOKEN_IDENTIFIER) {
      if (TVar1 != 0x7e) {
        if (TVar1 == 0x2d) {
          bVar7 = TVar9 == 0x29 || TVar9 == TOKEN_INT_LITERAL;
          if ((TVar9 == 0x29) || (TVar9 == TOKEN_INT_LITERAL)) {
            TVar1 = 0x2d;
          }
          else {
            TVar1 = TOKEN_PP_UNARY_MINUS;
          }
          goto LAB_0012a7b5;
        }
        bVar7 = true;
      }
      goto LAB_0012a8a9;
    }
    iVar2 = handle_pp_identifier(ctx);
    bVar12 = true;
    TVar1 = TVar9;
    if (iVar2 == 0) {
      if ((state->tokenlen != 7) || (iVar2 = bcmp(state->token,"defined",7), iVar2 != 0)) {
        if (0x7f < uVar11) {
          __assert_fail("outputsize < STATICARRAYLEN(output)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x6df,"int reduce_pp_expression(Context *)");
        }
        output[uVar11].isoperator = 0;
        output[uVar11].value = 0;
        goto LAB_0012a969;
      }
      TVar4 = lexer(state);
      TVar1 = TVar4;
      if (TVar4 == 0x28) {
        TVar1 = lexer(state);
      }
      if (TVar1 != TOKEN_IDENTIFIER) {
        reason = "operator \'defined\' requires an identifier";
        goto LAB_0012ad76;
      }
      pDVar5 = find_define_by_token(ctx);
      if ((TVar4 == 0x28) && (TVar1 = lexer(state), TVar1 != 0x29)) {
        reason = "Unmatched \')\'";
        ctx = local_948;
        goto LAB_0012ad76;
      }
      if (0x7f < uVar11) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x6d9,"int reduce_pp_expression(Context *)");
      }
      output[uVar11].isoperator = 0;
      output[uVar11].value = (uint)(pDVar5 != (Define *)0x0);
      uVar11 = uVar11 + 1;
      bVar12 = true;
      ctx = local_948;
      TVar1 = TVar9;
    }
  }
  goto LAB_0012aa6e;
LAB_0012a8a9:
  ctx->recursion_count = 0;
  bVar12 = false;
  if (TVar1 != 10) {
    if (TVar1 == 0x28) {
      if (0x3f < uVar8) {
        __assert_fail("stacksize < STATICARRAYLEN(stack)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x6e7,"int reduce_pp_expression(Context *)");
      }
      stack[uVar8] = 0x28;
      uVar8 = uVar8 + 1;
      bVar12 = true;
      TVar1 = 0x28;
    }
    else if (TVar1 == TOKEN_EOI) {
      bVar12 = false;
      TVar1 = TOKEN_EOI;
      if (state != local_940) {
        pop_source(ctx);
        bVar12 = true;
        TVar1 = TVar9;
      }
    }
    else if (TVar1 == TOKEN_INT_LITERAL) {
      if (0x7f < uVar11) {
        __assert_fail("outputsize < STATICARRAYLEN(output)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x6e3,"int reduce_pp_expression(Context *)");
      }
      output[uVar11].isoperator = 0;
      iVar2 = token_to_int(state);
      output[uVar11].value = iVar2;
LAB_0012a969:
      uVar11 = uVar11 + 1;
      bVar12 = true;
      TVar1 = TOKEN_INT_LITERAL;
    }
    else if (TVar1 == 0x29) {
      while( true ) {
        uVar8 = uVar8 - 1;
        if (uVar8 == 0xffffffffffffffff) goto LAB_0012ad6c;
        TVar1 = stack[uVar8];
        if (TVar1 == 0x28) break;
        if (0x7f < uVar11) {
          __assert_fail("outputsize < STATICARRAYLEN(output)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x6f4,"int reduce_pp_expression(Context *)");
        }
        output[uVar11].isoperator = 1;
        output[uVar11].value = TVar1;
        uVar11 = uVar11 + 1;
      }
      bVar12 = true;
      TVar1 = 0x29;
    }
    else {
LAB_0012a7bd:
      iVar2 = find_precedence(TVar1);
      if (iVar2 < 0) {
        pushback(state);
        reason = "Invalid expression";
        ctx = local_948;
        goto LAB_0012ad76;
      }
      while (uVar8 != 0) {
        TVar9 = stack[uVar8 - 1];
        iVar3 = find_precedence(TVar9);
        if (iVar3 < 0) {
LAB_0012a82f:
          if (0x3f < uVar8) {
            __assert_fail("stacksize < STATICARRAYLEN(stack)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x71a,"int reduce_pp_expression(Context *)");
          }
          break;
        }
        bVar12 = iVar2 < iVar3;
        if (bVar7) {
          bVar12 = iVar2 <= iVar3;
        }
        if (!bVar12) goto LAB_0012a82f;
        if (0x7f < uVar11) {
          __assert_fail("outputsize < STATICARRAYLEN(output)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x713,"int reduce_pp_expression(Context *)");
        }
        output[uVar11].isoperator = 1;
        output[uVar11].value = TVar9;
        uVar11 = uVar11 + 1;
        uVar8 = uVar8 - 1;
      }
      stack[uVar8] = TVar1;
      uVar8 = uVar8 + 1;
      bVar12 = true;
      ctx = local_948;
    }
  }
  goto LAB_0012a709;
LAB_0012aa6e:
  bVar12 = uVar8 == 0;
  uVar8 = uVar8 - 1;
  if (bVar12) goto code_r0x0012aa74;
  TVar1 = stack[uVar8];
  if (TVar1 == 0x28) goto LAB_0012ad6c;
  if (0x7f < uVar11) {
    __assert_fail("outputsize < STATICARRAYLEN(output)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x729,"int reduce_pp_expression(Context *)");
  }
  output[uVar11].isoperator = 1;
  output[uVar11].value = TVar1;
  uVar11 = uVar11 + 1;
  goto LAB_0012aa6e;
code_r0x0012aa74:
  piVar10 = &output[0].value;
  uVar8 = 0;
LAB_0012aa91:
  if ((int)uVar11 < 1) goto LAB_0012ada6;
  if (((RpnTokens *)(piVar10 + -1))->isoperator == 0) {
    if (0x7f < uVar8) {
      __assert_fail("stacksize < STATICARRAYLEN(stack)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x648,"long interpret_rpn(const RpnTokens *, int, int *)");
    }
    local_938[uVar8] = (long)*piVar10;
    uVar8 = uVar8 + 1;
    goto LAB_0012ad3c;
  }
  iVar2 = *piVar10;
  switch(iVar2) {
  case 0x111:
    if (1 < uVar8) {
      (&local_948)[uVar8] =
           (Context_conflict1 *)((long)(&local_948)[uVar8] >> ((byte)local_938[uVar8 - 1] & 0x3f));
      goto LAB_0012ad39;
    }
    goto switchD_0012ab50_caseD_22;
  case 0x112:
    if (1 < uVar8) {
      (&local_948)[uVar8] =
           (Context_conflict1 *)((long)(&local_948)[uVar8] << ((byte)local_938[uVar8 - 1] & 0x3f));
      goto LAB_0012ad39;
    }
    goto switchD_0012ab50_caseD_22;
  case 0x113:
    if (1 < uVar8) {
      if ((&local_948)[uVar8] == (Context_conflict1 *)0x0) {
        pCVar6 = (Context_conflict1 *)0x0;
      }
      else {
LAB_0012ac5b:
        pCVar6 = (Context_conflict1 *)(ulong)(local_938[uVar8 - 1] != 0);
      }
      goto LAB_0012ac66;
    }
    goto switchD_0012ab50_caseD_22;
  case 0x114:
    if (1 < uVar8) {
      pCVar6 = (Context_conflict1 *)0x1;
      if ((&local_948)[uVar8] == (Context_conflict1 *)0x0) goto LAB_0012ac5b;
LAB_0012ac66:
      (&local_948)[uVar8] = pCVar6;
      uVar8 = uVar8 - 1;
      goto LAB_0012ad3c;
    }
    goto switchD_0012ab50_caseD_22;
  case 0x115:
    if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
    pCVar6 = (Context_conflict1 *)(ulong)((long)(&local_948)[uVar8] <= (long)local_938[uVar8 - 1]);
    break;
  case 0x116:
    if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
    pCVar6 = (Context_conflict1 *)(ulong)((long)local_938[uVar8 - 1] <= (long)(&local_948)[uVar8]);
    break;
  case 0x117:
    if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
    pCVar6 = (Context_conflict1 *)
             (ulong)((&local_948)[uVar8] == (Context_conflict1 *)local_938[uVar8 - 1]);
    break;
  case 0x118:
    if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
    pCVar6 = (Context_conflict1 *)
             (ulong)((&local_948)[uVar8] != (Context_conflict1 *)local_938[uVar8 - 1]);
    break;
  default:
    switch(iVar2) {
    case 0x21:
      if (uVar8 != 0) {
        local_938[uVar8 - 1] = (ulong)(local_938[uVar8 - 1] == 0);
        goto LAB_0012ad3c;
      }
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
      goto switchD_0012ab50_caseD_22;
    case 0x25:
      if (1 < uVar8) {
        (&local_948)[uVar8] =
             (Context_conflict1 *)((long)(&local_948)[uVar8] % (long)local_938[uVar8 - 1]);
        break;
      }
      goto switchD_0012ab50_caseD_22;
    case 0x26:
      if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
      (&local_948)[uVar8] = (Context_conflict1 *)((ulong)(&local_948)[uVar8] & local_938[uVar8 - 1])
      ;
      break;
    case 0x2a:
      if (1 < uVar8) {
        pCVar6 = (Context_conflict1 *)(local_938[uVar8 - 1] * (long)(&local_948)[uVar8]);
        goto LAB_0012abb6;
      }
      goto switchD_0012ab50_caseD_22;
    case 0x2b:
      if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
      (&local_948)[uVar8] =
           (Context_conflict1 *)((&local_948)[uVar8]->failstr + (local_938[uVar8 - 1] - 8));
      break;
    case 0x2d:
      if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
      (&local_948)[uVar8] = (Context_conflict1 *)((long)(&local_948)[uVar8] - local_938[uVar8 - 1]);
      break;
    case 0x2f:
      if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
      pCVar6 = (Context_conflict1 *)((long)(&local_948)[uVar8] / (long)local_938[uVar8 - 1]);
LAB_0012abb6:
      (&local_948)[uVar8] = pCVar6;
      break;
    default:
      if (iVar2 == 0x3c) {
        if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
        pCVar6 = (Context_conflict1 *)
                 (ulong)((long)(&local_948)[uVar8] < (long)local_938[uVar8 - 1]);
        goto LAB_0012ad34;
      }
      if (iVar2 == 0x3e) {
        if (1 < uVar8) {
          pCVar6 = (Context_conflict1 *)
                   (ulong)((long)local_938[uVar8 - 1] < (long)(&local_948)[uVar8]);
          goto LAB_0012ad34;
        }
        goto switchD_0012ab50_caseD_22;
      }
      if (iVar2 != 0x5e) {
        if (iVar2 == 0x7c) {
          if (1 < uVar8) {
            (&local_948)[uVar8] =
                 (Context_conflict1 *)((ulong)(&local_948)[uVar8] | local_938[uVar8 - 1]);
            break;
          }
          goto switchD_0012ab50_caseD_22;
        }
        if (iVar2 == 0x7e) {
          if (uVar8 == 0) goto switchD_0012ab50_caseD_22;
          local_938[uVar8 - 1] = ~local_938[uVar8 - 1];
        }
        else {
          if (iVar2 != 0x12d) {
            if ((iVar2 == 0x12e) && (uVar8 != 0)) goto LAB_0012ad3c;
            goto switchD_0012ab50_caseD_22;
          }
          if (uVar8 == 0) goto switchD_0012ab50_caseD_22;
          local_938[uVar8 - 1] = -local_938[uVar8 - 1];
        }
        goto LAB_0012ad3c;
      }
      if (uVar8 < 2) goto switchD_0012ab50_caseD_22;
      (&local_948)[uVar8] = (Context_conflict1 *)((ulong)(&local_948)[uVar8] ^ local_938[uVar8 - 1])
      ;
    }
    goto LAB_0012ad39;
  }
LAB_0012ad34:
  (&local_948)[uVar8] = pCVar6;
LAB_0012ad39:
  uVar8 = uVar8 - 1;
LAB_0012ad3c:
  piVar10 = piVar10 + 2;
  uVar11 = (ulong)((int)uVar11 - 1);
  goto LAB_0012aa91;
LAB_0012ad6c:
  reason = "Unmatched \')\'";
  goto LAB_0012ad76;
LAB_0012ada6:
  if (uVar8 == 1) {
    return (uint)(local_938[0] != 0);
  }
switchD_0012ab50_caseD_22:
  reason = "Invalid expression";
LAB_0012ad76:
  fail(ctx,reason);
  return -1;
}

Assistant:

static int reduce_pp_expression(Context *ctx)
{
    IncludeState *orig_state = ctx->include_stack;
    RpnTokens output[128];
    Token stack[64];
    Token previous_token = TOKEN_UNKNOWN;
    size_t outputsize = 0;
    size_t stacksize = 0;
    int matched = 0;
    int done = 0;

    #define ADD_TO_OUTPUT(op, val) \
        assert(outputsize < STATICARRAYLEN(output)); \
        output[outputsize].isoperator = op; \
        output[outputsize].value = val; \
        outputsize++;

    #define PUSH_TO_STACK(t) \
        assert(stacksize < STATICARRAYLEN(stack)); \
        stack[stacksize] = t; \
        stacksize++;

    while (!done)
    {
        IncludeState *state = ctx->include_stack;
        Token token = lexer(state);
        int isleft = 1;
        int precedence = -1;

        if ( (token == ((Token) '!')) || (token == ((Token) '~')) )
            isleft = 0;
        else if (token == ((Token) '-'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_MINUS;
        } // else if
        else if (token == ((Token) '+'))
        {
            isleft = ((previous_token == TOKEN_INT_LITERAL) ||
                      (previous_token == ((Token) ')')));
            if (!isleft)
                token = TOKEN_PP_UNARY_PLUS;
        } // else if

        if (token != TOKEN_IDENTIFIER)
            ctx->recursion_count = 0;

        switch (token)
        {
            case TOKEN_EOI:
                if (state != orig_state)  // end of a substate, or the expr?
                {
                    pop_source(ctx);
                    continue;  // substate, go again with the parent state.
                } // if
                done = 1;  // the expression itself is done.
                break;

            case ((Token) '\n'):
                done = 1;
                break;  // we're done!

            case TOKEN_IDENTIFIER:
                if (handle_pp_identifier(ctx))
                    continue;  // go again with new IncludeState.

                if ( (state->tokenlen == 7) &&
                     (memcmp(state->token, "defined", 7) == 0) )
                {
                    token = lexer(state);
                    const int paren = (token == ((Token) '('));
                    if (paren)  // gcc doesn't let us nest parens here, either.
                        token = lexer(state);
                    if (token != TOKEN_IDENTIFIER)
                    {
                        fail(ctx, "operator 'defined' requires an identifier");
                        return -1;
                    } // if
                    const int found = (find_define_by_token(ctx) != NULL);

                    if (paren)
                    {
                        if (lexer(state) != ((Token) ')'))
                        {
                            fail(ctx, "Unmatched ')'");
                            return -1;
                        } // if
                    } // if

                    ADD_TO_OUTPUT(0, found);
                    continue;
                } // if

                // can't replace identifier with a number? It becomes zero.
                token = TOKEN_INT_LITERAL;
                ADD_TO_OUTPUT(0, 0);
                break;

            case TOKEN_INT_LITERAL:
                ADD_TO_OUTPUT(0, token_to_int(state));
                break;

            case ((Token) '('):
                PUSH_TO_STACK((Token) '(');
                break;

            case ((Token) ')'):
                matched = 0;
                while (stacksize > 0)
                {
                    const Token t = stack[--stacksize];
                    if (t == ((Token) '('))
                    {
                        matched = 1;
                        break;
                    } // if
                    ADD_TO_OUTPUT(1, t);
                } // while

                if (!matched)
                {
                    fail(ctx, "Unmatched ')'");
                    return -1;
                } // if
                break;

            default:
                precedence = find_precedence(token);
                // bogus token, or two operators together.
                if (precedence < 0)
                {
                    pushback(state);
                    fail(ctx, "Invalid expression");
                    return -1;
                } // if

                else  // it's an operator.
                {
                    while (stacksize > 0)
                    {
                        const Token t = stack[stacksize-1];
                        const int p = find_precedence(t);
                        if ( (p >= 0) &&
                             ( ((isleft) && (precedence <= p)) ||
                               ((!isleft) && (precedence < p)) ) )
                        {
                            stacksize--;
                            ADD_TO_OUTPUT(1, t);
                        } // if
                        else
                        {
                            break;
                        } // else
                    } // while
                    PUSH_TO_STACK(token);
                } // else
                break;
        } // switch
        previous_token = token;
    } // while

    while (stacksize > 0)
    {
        const Token t = stack[--stacksize];
        if (t == ((Token) '('))
        {
            fail(ctx, "Unmatched ')'");
            return -1;
        } // if
        ADD_TO_OUTPUT(1, t);
    } // while

    #undef ADD_TO_OUTPUT
    #undef PUSH_TO_STACK

    // okay, you now have some validated data in reverse polish notation.
    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR EXPRESSION RPN:");
    int i = 0;
    for (i = 0; i < outputsize; i++)
    {
        if (!output[i].isoperator)
            printf(" %d", output[i].value);
        else
        {
            switch (output[i].value)
            {
                case TOKEN_OROR: printf(" ||"); break;
                case TOKEN_ANDAND: printf(" &&"); break;
                case TOKEN_NEQ: printf(" !="); break;
                case TOKEN_EQL: printf(" =="); break;
                case TOKEN_LEQ: printf(" <="); break;
                case TOKEN_GEQ: printf(" >="); break;
                case TOKEN_LSHIFT: printf(" <<"); break;
                case TOKEN_RSHIFT: printf(" >>"); break;
                case TOKEN_PP_UNARY_PLUS: printf(" +"); break;
                case TOKEN_PP_UNARY_MINUS: printf(" -"); break;
                default: printf(" %c", output[i].value); break;
            } // switch
        } // else
    } // for
    printf("\n");
    #endif

    int error = 0;
    const long val = interpret_rpn(output, outputsize, &error);

    #if DEBUG_PREPROCESSOR
    printf("PREPROCESSOR RPN RESULT: %ld%s\n", val, error ? " (ERROR)" : "");
    #endif

    if (error)
    {
        fail(ctx, "Invalid expression");
        return -1;
    } // if

    return ((val) ? 1 : 0);
}